

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReshapeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  undefined1 *puVar4;
  long *plVar5;
  size_type *psVar6;
  Result *_result;
  string err;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar3) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar3) {
          if (this->ndArrayInterpretation == true) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Reshape","");
            validateInputOutputRankEquality
                      (__return_storage_ptr__,layer,&local_70,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Reshape","");
            validateRankCount(__return_storage_ptr__,layer,&local_90,5,5,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (!bVar3) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar3) {
              return __return_storage_ptr__;
            }
          }
          if (layer->_oneof_case_[0] == 300) {
            puVar4 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar4 = Specification::_ReshapeLayerParams_default_instance_;
          }
          if ((((ConvolutionLayerParams *)puVar4)->kernelsize_).current_size_ - 3U < 2) {
            Result::Result(__return_storage_ptr__);
          }
          else {
            std::operator+(&local_50,"Reshape layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
            psVar6 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_90.field_2._M_allocated_capacity = *psVar6;
              local_90.field_2._8_8_ = plVar5[3];
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = *psVar6;
              local_90._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_90._M_string_length = plVar5[1];
            *plVar5 = (long)psVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReshapeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Reshape", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Reshape", 5, 5, blobNameToRank));
    }

    const auto& params = layer.reshape();
    if (params.targetshape_size() != 3 && params.targetshape_size() != 4) {
        std::string err = "Reshape layer '" + layer.name() + "' target shape must be 3D or 4D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}